

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineStateGLImpl::DvpVerifySRBResources
          (PipelineStateGLImpl *this,ShaderResourceCacheArrayType *ResourceCaches,
          BaseBindingsArrayType *BaseBindings)

{
  ShaderResourcesGL *this_00;
  PipelineResourceSignatureImplType *pPVar1;
  TBindings *pTVar2;
  pointer psVar3;
  GLResourceAttribs *pGVar4;
  TextureInfo *Attribs;
  ImageInfo *Attribs_00;
  char (*pacVar5) [56];
  char (*pacVar6) [56];
  Uint32 UVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 uVar10;
  Uint32 ShaderInd;
  HandleResourceHelper HandleResource;
  string msg_1;
  uint local_7c;
  string local_78;
  string local_58;
  ShaderResourceCacheArrayType *local_38;
  
  local_38 = ResourceCaches;
  PipelineStateBase<Diligent::EngineGLImplTraits>::CheckPipelineReady
            (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  uVar8 = (ulong)(this->super_PipelineStateBase<Diligent::EngineGLImplTraits>).m_SignatureCount;
  if (uVar8 != 0) {
    uVar9 = 0;
    do {
      pPVar1 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetResourceSignature
                         (&this->super_PipelineStateBase<Diligent::EngineGLImplTraits>,(Uint32)uVar9
                         );
      if (((pPVar1 != (PipelineResourceSignatureImplType *)0x0) &&
          ((pPVar1->super_PipelineResourceSignatureBase<Diligent::EngineGLImplTraits>).
           super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineResourceSignatureDesc>
           .m_Desc.NumResources != 0)) &&
         (pTVar2 = GetBaseBindings(this,(Uint32)uVar9),
         *(long *)pTVar2->_M_elems !=
         *(long *)((array<unsigned_short,_4UL> *)BaseBindings->_M_elems[0]._M_elems)->_M_elems)) {
        FormatString<char[124]>
                  (&local_78,
                   (char (*) [124])
                   "Bound resources use incorrect base binding indices. This may indicate a bug in resource signature compatibility comparison."
                  );
        DebugAssertionFailed
                  (local_78._M_dataplus._M_p,"DvpVerifySRBResources",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                   ,0x2e9);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      uVar9 = uVar9 + 1;
      BaseBindings = (BaseBindingsArrayType *)((long)BaseBindings + 8);
    } while (uVar8 != uVar9);
  }
  local_78.field_2._8_8_ = &local_7c;
  local_7c = 0;
  uVar10 = (this->m_ResourceAttibutions).
           super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78._M_string_length = (size_type)local_38;
  psVar3 = (this->m_ShaderResources).
           super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pacVar6 = (char (*) [56])
            ((long)(this->m_ShaderResources).
                   super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4);
  pacVar5 = (char (*) [56])
            ((long)(this->m_ShaderNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_ShaderNames).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  local_78._M_dataplus._M_p = (pointer)this;
  local_78.field_2._M_allocated_capacity = uVar10;
  if (pacVar6 == pacVar5) {
    pacVar5 = (char (*) [56])0x0;
  }
  else {
    FormatString<char[26],char[49]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_ShaderResources.size() == m_ShaderNames.size()",
               (char (*) [49])pacVar5);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"DvpVerifySRBResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x313);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    pacVar5 = (char (*) [56])(ulong)local_7c;
    psVar3 = (this->m_ShaderResources).
             super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pacVar6 = (char (*) [56])
              ((long)(this->m_ShaderResources).
                     super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4);
  }
  if (pacVar5 < pacVar6) {
    do {
      this_00 = psVar3[(long)pacVar5].
                super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr;
      if (this_00->m_NumUniformBuffers != 0) {
        UVar7 = 0;
        do {
          pGVar4 = &ShaderResourcesGL::GetUniformBuffer(this_00,UVar7)->super_GLResourceAttribs;
          DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
          ::RESOURCE_DIMENSION_bool_(&local_78,pGVar4,RESOURCE_DIM_BUFFER,false);
          UVar7 = UVar7 + 1;
        } while (UVar7 < this_00->m_NumUniformBuffers);
      }
      if (this_00->m_NumTextures != 0) {
        UVar7 = 0;
        do {
          Attribs = ShaderResourcesGL::GetTexture(this_00,UVar7);
          DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
          ::RESOURCE_DIMENSION_bool_
                    (&local_78,&Attribs->super_GLResourceAttribs,Attribs->ResourceDim,
                     Attribs->IsMultisample);
          UVar7 = UVar7 + 1;
        } while (UVar7 < this_00->m_NumTextures);
      }
      if (this_00->m_NumImages != 0) {
        UVar7 = 0;
        do {
          Attribs_00 = ShaderResourcesGL::GetImage(this_00,UVar7);
          DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
          ::RESOURCE_DIMENSION_bool_
                    (&local_78,&Attribs_00->super_GLResourceAttribs,Attribs_00->ResourceDim,
                     Attribs_00->IsMultisample);
          UVar7 = UVar7 + 1;
        } while (UVar7 < this_00->m_NumImages);
      }
      if (this_00->m_NumStorageBlocks != 0) {
        UVar7 = 0;
        do {
          pGVar4 = &ShaderResourcesGL::GetStorageBlock(this_00,UVar7)->super_GLResourceAttribs;
          DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
          ::RESOURCE_DIMENSION_bool_(&local_78,pGVar4,RESOURCE_DIM_BUFFER,false);
          UVar7 = UVar7 + 1;
        } while (UVar7 < this_00->m_NumStorageBlocks);
      }
      local_7c = local_7c + 1;
      pacVar5 = (char (*) [56])(ulong)local_7c;
      psVar3 = (this->m_ShaderResources).
               super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar10 = local_78.field_2._M_allocated_capacity;
    } while (pacVar5 < (char (*) [56])
                       ((long)(this->m_ShaderResources).
                              super__Vector_base<std::shared_ptr<const_Diligent::ShaderResourcesGL>,_std::allocator<std::shared_ptr<const_Diligent::ShaderResourcesGL>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)psVar3 >> 4));
  }
  if ((pointer)uVar10 !=
      (this->m_ResourceAttibutions).
      super__Vector_base<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution,_std::allocator<Diligent::PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    FormatString<char[26],char[56]>
              (&local_58,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"HandleResource.attrib_it == m_ResourceAttibutions.end()",pacVar5);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"DvpVerifySRBResources",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
               ,0x319);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void PipelineStateGLImpl::DvpVerifySRBResources(const ShaderResourceCacheArrayType& ResourceCaches,
                                                const BaseBindingsArrayType&        BaseBindings) const
{
    // Verify base bindings
    const auto SignCount = GetResourceSignatureCount();
    for (Uint32 sign = 0; sign < SignCount; ++sign)
    {
        const auto* pSignature = GetResourceSignature(sign);
        if (pSignature == nullptr || pSignature->GetTotalResourceCount() == 0)
            continue;

        DEV_CHECK_ERR(GetBaseBindings(sign) == BaseBindings[sign],
                      "Bound resources use incorrect base binding indices. This may indicate a bug in resource signature compatibility comparison.");
    }

    using AttribIter = std::vector<ResourceAttribution>::const_iterator;
    struct HandleResourceHelper
    {
        PipelineStateGLImpl const&          PSO;
        const ShaderResourceCacheArrayType& ResourceCaches;
        AttribIter                          attrib_it;
        Uint32&                             shader_ind;

        HandleResourceHelper(const PipelineStateGLImpl&          _PSO,
                             const ShaderResourceCacheArrayType& _ResourceCaches,
                             AttribIter                          _iter,
                             Uint32&                             _ind) :
            PSO{_PSO},
            ResourceCaches{_ResourceCaches},
            attrib_it{_iter},
            shader_ind{_ind}
        {}

        void Validate(const ShaderResourcesGL::GLResourceAttribs& Attribs, RESOURCE_DIMENSION ResDim, bool IsMS)
        {
            if (*attrib_it && !attrib_it->IsImmutableSampler())
            {
                const auto* pResourceCache = ResourceCaches[attrib_it->SignatureIndex];
                DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at index ", attrib_it->SignatureIndex, " is null.");
                attrib_it->pSignature->DvpValidateCommittedResource(Attribs, ResDim, IsMS, attrib_it->ResourceIndex, *pResourceCache,
                                                                    PSO.m_ShaderNames[shader_ind].c_str(), PSO.m_Desc.Name);
            }
            ++attrib_it;
        }

        void operator()(const ShaderResourcesGL::StorageBlockInfo& Attribs) { Validate(Attribs, RESOURCE_DIM_BUFFER, false); }
        void operator()(const ShaderResourcesGL::UniformBufferInfo& Attribs) { Validate(Attribs, RESOURCE_DIM_BUFFER, false); }
        void operator()(const ShaderResourcesGL::TextureInfo& Attribs) { Validate(Attribs, Attribs.ResourceDim, Attribs.IsMultisample); }
        void operator()(const ShaderResourcesGL::ImageInfo& Attribs) { Validate(Attribs, Attribs.ResourceDim, Attribs.IsMultisample); }
    };

    Uint32               ShaderInd = 0;
    HandleResourceHelper HandleResource{*this, ResourceCaches, m_ResourceAttibutions.begin(), ShaderInd};

    VERIFY_EXPR(m_ShaderResources.size() == m_ShaderNames.size());
    for (; ShaderInd < m_ShaderResources.size(); ++ShaderInd)
    {
        m_ShaderResources[ShaderInd]->ProcessConstResources(std::ref(HandleResource), std::ref(HandleResource),
                                                            std::ref(HandleResource), std::ref(HandleResource));
    }
    VERIFY_EXPR(HandleResource.attrib_it == m_ResourceAttibutions.end());
}